

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::FCDUTF8CollationIterator::previousCodePoint
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  int32_t *piVar1;
  int32_t *piVar2;
  uint8_t uVar3;
  byte bVar4;
  State SVar5;
  uint8_t *puVar6;
  UBool UVar7;
  int iVar8;
  UChar32 UVar9;
  long lVar10;
  uint c;
  uint uVar11;
  
  piVar1 = &(this->super_UTF8CollationIterator).pos;
  do {
    while (SVar5 = this->state, SVar5 == IN_FCD_SEGMENT) {
      iVar8 = (this->super_UTF8CollationIterator).pos;
      if (iVar8 != this->start) {
        puVar6 = (this->super_UTF8CollationIterator).u8;
        (this->super_UTF8CollationIterator).pos = iVar8 + -1;
        bVar4 = puVar6[(long)iVar8 + -1];
        if ((char)bVar4 < '\0') {
          UVar9 = utf8_prevCharSafeBody_63(puVar6,0,piVar1,(uint)bVar4,-3);
          return UVar9;
        }
        return (uint)bVar4;
      }
LAB_0024f610:
      switchToBackward(this);
    }
    if (SVar5 != CHECK_BWD) {
      if (*piVar1 != 0 && 2 < (int)SVar5) {
        uVar11 = icu_63::UnicodeString::char32At(&this->normalized,*piVar1 + -1);
        piVar1 = &(this->super_UTF8CollationIterator).pos;
        *piVar1 = *piVar1 + (uVar11 < 0x10000 | 0xfffffffe);
        return uVar11;
      }
      goto LAB_0024f610;
    }
    iVar8 = *piVar1;
    lVar10 = (long)iVar8;
    if (lVar10 == 0) {
      return -1;
    }
    puVar6 = (this->super_UTF8CollationIterator).u8;
    uVar3 = puVar6[lVar10 + -1];
    if (-1 < (char)uVar3) {
      *piVar1 = iVar8 + -1;
      return (int)(char)uVar3;
    }
    *piVar1 = iVar8 + -1;
    uVar11 = (uint)puVar6[lVar10 + -1];
    if ((char)puVar6[lVar10 + -1] < '\0') {
      uVar11 = utf8_prevCharSafeBody_63(puVar6,0,piVar1,uVar11,-3);
    }
    c = (uVar11 >> 10) + 0xd7c0 & 0xffff;
    if ((int)uVar11 < 0x10000) {
      c = uVar11;
    }
    UVar7 = CollationFCD::hasLccc(c);
    if (UVar7 == '\0') {
      return uVar11;
    }
    if ((uVar11 & 0x1fff01) == 0xf01) {
LAB_0024f5b8:
      iVar8 = 3;
      if ((0xd7ff < uVar11) && (iVar8 = 0, 0xffefdfff < uVar11 - 0x110000)) {
        iVar8 = 4 - (uint)(uVar11 < 0x10000);
      }
    }
    else {
      if (*piVar1 == 0) {
        return uVar11;
      }
      UVar7 = previousHasTccc(this);
      if (UVar7 == '\0') {
        return uVar11;
      }
      iVar8 = 1;
      if ((0x7f < uVar11) && (iVar8 = 2, 0x7ff < uVar11)) goto LAB_0024f5b8;
    }
    piVar2 = &(this->super_UTF8CollationIterator).pos;
    *piVar2 = *piVar2 + iVar8;
    UVar7 = previousSegment(this,errorCode);
    if (UVar7 == '\0') {
      return -1;
    }
  } while( true );
}

Assistant:

UChar32
FCDUTF8CollationIterator::previousCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == CHECK_BWD) {
            if(pos == 0) {
                return U_SENTINEL;
            }
            if(U8_IS_SINGLE(c = u8[pos - 1])) {
                --pos;
                return c;
            }
            U8_PREV_OR_FFFD(u8, 0, pos, c);
            if(CollationFCD::hasLccc(c <= 0xffff ? c : U16_LEAD(c)) &&
                    (CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != 0 && previousHasTccc()))) {
                // c is not FCD-inert, therefore it is not U+FFFD and it has a valid byte sequence
                // and we can use U8_LENGTH() rather than a previous-position variable.
                pos += U8_LENGTH(c);
                if(!previousSegment(errorCode)) {
                    return U_SENTINEL;
                }
                continue;
            }
            return c;
        } else if(state == IN_FCD_SEGMENT && pos != start) {
            U8_PREV_OR_FFFD(u8, 0, pos, c);
            return c;
        } else if(state >= IN_NORMALIZED && pos != 0) {
            c = normalized.char32At(pos - 1);
            pos -= U16_LENGTH(c);
            return c;
        } else {
            switchToBackward();
        }
    }
}